

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *p,Gia_Obj_t *pObj,int f,int fUseId)

{
  sat_solver2 *psVar1;
  Gia_Man_t *p_00;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined8 in_RAX;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *vCnf0;
  Vec_Int_t *vCnf1;
  ulong uVar7;
  undefined8 local_38;
  
  local_38 = in_RAX;
  iVar4 = Ga2_ObjFindOrAddLit(p,pObj,f);
  if (iVar4 < 2) {
    __assert_fail("iLitOut > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                  ,0x31d,"void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *, Gia_Obj_t *, int, int)");
  }
  uVar7 = *(ulong *)pObj;
  if ((~uVar7 & 0x1fffffff1fffffff) != 0) {
    iVar5 = Gia_ObjIsRo(p->pGia,pObj);
    uVar7 = *(ulong *)pObj;
    if ((iVar5 == 0) && (((int)(uint)uVar7 < 0 || (((uint)uVar7 & 0x1fffffff) == 0x1fffffff)))) {
      __assert_fail("Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x31e,"void Ga2_ManAddToAbsOneStatic(Ga2_Man_t *, Gia_Obj_t *, int, int)");
    }
  }
  if (((~uVar7 & 0x1fffffff1fffffff) == 0) ||
     ((f == 0 && (iVar5 = Gia_ObjIsRo(p->pGia,pObj), iVar5 != 0)))) {
    local_38 = CONCAT44(iVar4,(int)local_38) ^ 0x100000000;
    psVar1 = p->pSat;
    iVar4 = Gia_ObjId(p->pGia,pObj);
    sat_solver2_addclause(psVar1,(lit *)((long)&local_38 + 4),(lit *)&stack0xffffffffffffffd0,iVar4)
    ;
    return;
  }
  local_38 = CONCAT44(local_38._4_4_,iVar4);
  p->vLits->nSize = 0;
  Ga2_ObjLeaves(p->pGia,pObj);
  bVar3 = true;
  for (iVar4 = 0; iVar4 < Ga2_ObjLeaves::v.nSize; iVar4 = iVar4 + 1) {
    p_00 = p->pGia;
    iVar5 = Vec_IntEntry(&Ga2_ObjLeaves::v,iVar4);
    pObj_00 = Gia_ManObj(p_00,iVar5);
    if (pObj_00 == (Gia_Obj_t *)0x0) break;
    iVar5 = Gia_ObjIsRo(p->pGia,pObj);
    iVar5 = Ga2_ObjFindOrAddLit(p,pObj_00,f - iVar5);
    Vec_IntPush(p->vLits,iVar5);
    if (iVar5 < 2) {
      bVar3 = false;
    }
  }
  if ((!bVar3) && (iVar4 = Gia_ObjIsRo(p->pGia,pObj), iVar4 == 0)) {
    uVar6 = Ga2_ObjComputeTruthSpecial(p->pGia,pObj,&Ga2_ObjLeaves::v,p->vLits);
    piVar2 = p->vLits->pArray;
    iVar4 = Gia_ObjId(p->pGia,pObj);
    Ga2_ManCnfAddDynamic(p,uVar6 & 0xffff,piVar2,(int)local_38,iVar4);
    return;
  }
  psVar1 = p->pSat;
  vCnf0 = Ga2_ObjCnf0(p,pObj);
  vCnf1 = Ga2_ObjCnf1(p,pObj);
  piVar2 = p->vLits->pArray;
  iVar4 = Gia_ObjId(p->pGia,pObj);
  Ga2_ManCnfAddStatic(psVar1,vCnf0,vCnf1,piVar2,(int)local_38,iVar4);
  return;
}

Assistant:

static inline void Ga2_ManAddToAbsOneStatic( Ga2_Man_t * p, Gia_Obj_t * pObj, int f, int fUseId )
{
    Vec_Int_t * vLeaves;
    Gia_Obj_t * pLeaf;
    int k, Lit, iLitOut = Ga2_ObjFindOrAddLit( p, pObj, f );
    assert( iLitOut > 1 );
    assert( Gia_ObjIsConst0(pObj) || Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsConst0(pObj) || (f == 0 && Gia_ObjIsRo(p->pGia, pObj)) )
    {
        iLitOut = Abc_LitNot( iLitOut );
        sat_solver2_addclause( p->pSat, &iLitOut, &iLitOut + 1, fUseId ? Gia_ObjId(p->pGia, pObj) : -1 );
    }
    else
    {
        int fUseStatic = 1;
        Vec_IntClear( p->vLits );
        vLeaves = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vLeaves, p->pGia, pLeaf, k )
        {
            Lit = Ga2_ObjFindOrAddLit( p, pLeaf, f - Gia_ObjIsRo(p->pGia, pObj) );
            Vec_IntPush( p->vLits, Lit );
            if ( Lit < 2 )
                fUseStatic = 0;
        }
        if ( fUseStatic || Gia_ObjIsRo(p->pGia, pObj) )
            Ga2_ManCnfAddStatic( p->pSat, Ga2_ObjCnf0(p, pObj), Ga2_ObjCnf1(p, pObj), Vec_IntArray(p->vLits), iLitOut, fUseId ? Gia_ObjId(p->pGia, pObj) : -1 );
        else
        {
            unsigned uTruth = Ga2_ObjComputeTruthSpecial( p->pGia, pObj, vLeaves, p->vLits );
            Ga2_ManCnfAddDynamic( p, uTruth & 0xFFFF, Vec_IntArray(p->vLits), iLitOut, Gia_ObjId(p->pGia, pObj) );
        }
    }
}